

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_search.c
# Opt level: O2

void interp_model_rd_eval
               (MACROBLOCK *x,AV1_COMP *cpi,BLOCK_SIZE bsize,BUFFER_SET *orig_dst,int plane_from,
               int plane_to,RD_STATS *rd_stats,int is_skip_build_pred)

{
  RD_STATS tmp_rd_stats;
  RD_STATS local_58;
  
  local_58.rate = 0;
  local_58.zero_rate = 0;
  local_58.dist = 0;
  local_58.rdcost = 0;
  local_58.sse = 0;
  local_58.skip_txfm = '\x01';
  if (is_skip_build_pred == 0) {
    av1_enc_build_inter_predictor
              (&cpi->common,&x->e_mbd,(x->e_mbd).mi_row,(x->e_mbd).mi_col,orig_dst,bsize,plane_from,
               plane_to);
  }
  (*model_rd_sb_fn[(cpi->sf).rt_sf.use_simple_rd_model == 0])
            (cpi,bsize,x,&x->e_mbd,plane_from,plane_to,&local_58.rate,&local_58.dist,
             &local_58.skip_txfm,&local_58.sse,(int *)0x0,(int64_t *)0x0,(int64_t *)0x0);
  av1_merge_rd_stats(rd_stats,&local_58);
  return;
}

Assistant:

static inline void interp_model_rd_eval(
    MACROBLOCK *const x, const AV1_COMP *const cpi, BLOCK_SIZE bsize,
    const BUFFER_SET *const orig_dst, int plane_from, int plane_to,
    RD_STATS *rd_stats, int is_skip_build_pred) {
  const AV1_COMMON *cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  RD_STATS tmp_rd_stats;
  av1_init_rd_stats(&tmp_rd_stats);

  // Skip inter predictor if the predictor is already available.
  if (!is_skip_build_pred) {
    const int mi_row = xd->mi_row;
    const int mi_col = xd->mi_col;
    av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, orig_dst, bsize,
                                  plane_from, plane_to);
  }

  model_rd_sb_fn[cpi->sf.rt_sf.use_simple_rd_model
                     ? MODELRD_LEGACY
                     : MODELRD_TYPE_INTERP_FILTER](
      cpi, bsize, x, xd, plane_from, plane_to, &tmp_rd_stats.rate,
      &tmp_rd_stats.dist, &tmp_rd_stats.skip_txfm, &tmp_rd_stats.sse, NULL,
      NULL, NULL);

  av1_merge_rd_stats(rd_stats, &tmp_rd_stats);
}